

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void __thiscall
VectorFormatter<DefaultFormatter>::
Ser<SizeComputer,std::vector<PrefilledTransaction,std::allocator<PrefilledTransaction>>>
          (VectorFormatter<DefaultFormatter> *this,SizeComputer *s,
          vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_> *v)

{
  pointer pPVar1;
  ulong uVar2;
  long lVar3;
  const_iterator __begin0;
  pointer pPVar4;
  const_iterator __end0;
  long in_FS_OFFSET;
  ParamsStream<SizeComputer_&,_TransactionSerParams> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pPVar4 = (v->super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (v->super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  uVar2 = ((long)pPVar1 - (long)pPVar4 >> 3) * -0x5555555555555555;
  lVar3 = 1;
  if ((0xfc < uVar2) && (lVar3 = 3, 0xffff < uVar2)) {
    lVar3 = (ulong)(uVar2 >> 0x20 != 0) * 4 + 5;
  }
  s->nSize = s->nSize + lVar3;
  if (pPVar4 != pPVar1) {
    do {
      WriteCompactSize<SizeComputer>(s,(ulong)pPVar4->index);
      local_40.m_params = &::TX_WITH_WITNESS;
      local_40.m_substream = s;
      SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
                ((pPVar4->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,&local_40,&::TX_WITH_WITNESS);
      pPVar4 = pPVar4 + 1;
    } while (pPVar4 != pPVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }